

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TextureSwizzle::FunctionalTest::prepareProgram
          (FunctionalTest *this,size_t format_idx,programInfo *program)

{
  size_t position;
  string fs;
  size_t local_b0;
  string local_a8;
  string local_88;
  undefined1 local_68 [32];
  undefined8 local_48;
  undefined8 uStack_40;
  GLint local_38 [6];
  
  prepareValues_abi_cxx11_(&local_88,(FunctionalTest *)format_idx,format_idx);
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 0;
  local_38[3] = 0;
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  uStack_40._0_4_ = 0;
  uStack_40._4_4_ = 0;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = 0;
  SmokeTest::getVertexShader_abi_cxx11_(&local_a8,&this->super_SmokeTest,(testCase *)local_68,false)
  ;
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "#version 330 core\n\nout PREFIXvec4 out_color;\n\nvoid main()\n{\n    out_color = PREFIXvec4(VALUES);\n}\n\n"
             ,"");
  local_b0 = 0;
  Utils::replaceToken("PREFIX",&local_b0,
                      *(GLchar **)(*(long *)(&DAT_021da0d8 + format_idx * 0x78) + 8),
                      (string *)local_68);
  Utils::replaceToken("PREFIX",&local_b0,
                      *(GLchar **)(*(long *)(&DAT_021da0d8 + format_idx * 0x78) + 8),
                      (string *)local_68);
  Utils::replaceToken("VALUES",&local_b0,local_88._M_dataplus._M_p,(string *)local_68);
  Utils::programInfo::build(program,(GLchar *)local_68._0_8_,local_a8._M_dataplus._M_p);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FunctionalTest::prepareProgram(size_t format_idx, Utils::programInfo& program)
{
	static const glw::GLchar* fs_template = "#version 330 core\n"
											"\n"
											"out PREFIXvec4 out_color;\n"
											"\n"
											"void main()\n"
											"{\n"
											"    out_color = PREFIXvec4(VALUES);\n"
											"}\n"
											"\n";

	const _texture_format& format = texture_formats[format_idx];
	const std::string&	 values = prepareValues(format_idx);
	const std::string&	 vs	 = getVertexShader(testCase(), false); /* Get blank VS */

	std::string fs		 = fs_template;
	size_t		position = 0;

	Utils::replaceToken("PREFIX", position, format.m_sampler.m_sampler_prefix, fs);
	Utils::replaceToken("PREFIX", position, format.m_sampler.m_sampler_prefix, fs);
	Utils::replaceToken("VALUES", position, values.c_str(), fs);

	program.build(fs.c_str(), vs.c_str());
}